

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantmatrix.cc
# Opt level: O3

void __thiscall
fasttext::QuantMatrix::QuantMatrix(QuantMatrix *this,DenseMatrix *mat,int32_t dsub,bool qnorm)

{
  int iVar1;
  int64_t iVar2;
  int64_t iVar3;
  ProductQuantizer *pPVar4;
  pointer *__ptr;
  
  iVar2 = Matrix::size(&mat->super_Matrix,0);
  iVar3 = Matrix::size(&mat->super_Matrix,1);
  Matrix::Matrix(&this->super_Matrix,iVar2,iVar3);
  (this->super_Matrix)._vptr_Matrix = (_func_int **)&PTR__QuantMatrix_0014abf8;
  (this->pq_)._M_t.
  super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
  ._M_t.
  super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
  .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl = (ProductQuantizer *)0x0
  ;
  (this->npq_)._M_t.
  super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
  ._M_t.
  super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
  .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl = (ProductQuantizer *)0x0
  ;
  (this->codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->norm_codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->norm_codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->norm_codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->qnorm_ = qnorm;
  iVar2 = Matrix::size(&mat->super_Matrix,0);
  iVar3 = Matrix::size(&mat->super_Matrix,1);
  iVar1 = (int)((iVar3 + dsub + -1) / (long)dsub) * (int)iVar2;
  this->codesize_ = iVar1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->codes_,(long)iVar1);
  pPVar4 = (ProductQuantizer *)operator_new(0x50);
  ProductQuantizer::ProductQuantizer(pPVar4,(int32_t)(this->super_Matrix).n_,dsub);
  std::__uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
  ::reset((__uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
           *)&this->pq_,pPVar4);
  if (this->qnorm_ == true) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->norm_codes_,(this->super_Matrix).m_);
    pPVar4 = (ProductQuantizer *)operator_new(0x50);
    ProductQuantizer::ProductQuantizer(pPVar4,1,1);
    std::
    __uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
    reset((__uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
           *)&this->npq_,pPVar4);
  }
  quantize(this,mat);
  return;
}

Assistant:

QuantMatrix::QuantMatrix(DenseMatrix&& mat, int32_t dsub, bool qnorm)
    : Matrix(mat.size(0), mat.size(1)),
      qnorm_(qnorm),
      codesize_(mat.size(0) * ((mat.size(1) + dsub - 1) / dsub)) {
  codes_.resize(codesize_);
  pq_ = std::unique_ptr<ProductQuantizer>(new ProductQuantizer(n_, dsub));
  if (qnorm_) {
    norm_codes_.resize(m_);
    npq_ = std::unique_ptr<ProductQuantizer>(new ProductQuantizer(1, 1));
  }
  quantize(std::forward<DenseMatrix>(mat));
}